

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChatBox.cpp
# Opt level: O1

void __thiscall gui::ChatBox::updateScroll(ChatBox *this,int delta)

{
  _Map_pointer ppCVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  iVar4 = delta + (int)this->verticalScroll_;
  ppCVar1 = (this->lines_).super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar3 = ((long)(this->lines_).
                 super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>._M_impl.
                 super__Deque_impl_data._M_start._M_last -
           (long)(this->lines_).
                 super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur >> 4) * -0x5555555555555555 +
          ((long)(this->lines_).
                 super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur -
           (long)(this->lines_).
                 super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_first >> 4) * -0x5555555555555555 +
          (((long)ppCVar1 -
            (long)(this->lines_).
                  super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node >> 3) + -1 +
          (ulong)(ppCVar1 == (_Map_pointer)0x0)) * 10;
  iVar2 = (int)lVar3 + -1;
  if (lVar3 == 0) {
    iVar2 = 0;
  }
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  if (iVar2 < iVar4) {
    iVar4 = iVar2;
  }
  if (this->verticalScroll_ == (long)iVar4) {
    return;
  }
  this->verticalScroll_ = (long)iVar4;
  this->visibleLinesChanged_ = true;
  Widget::requestRedraw(&this->super_Widget);
  return;
}

Assistant:

void ChatBox::updateScroll(int delta) {
    size_t newScroll = std::min(std::max(static_cast<int>(verticalScroll_) + delta, 0), static_cast<int>(lines_.size() > 0 ? lines_.size() - 1 : 0));
    if (verticalScroll_ != newScroll) {
        verticalScroll_ = newScroll;
        updateVisibleLines();
    }
}